

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfttest.cc
# Opt level: O0

void test::perft::testPosition(string *token,Board *pos)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int64_t __val;
  ostream *poVar4;
  void *this;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  string local_b0;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  int64_t nodes;
  string target;
  int depth;
  Board *pos_local;
  string *token_local;
  
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)token);
  target.field_2._12_4_ = *pcVar3 + -0x30;
  std::__cxx11::string::find((char)token,0x20);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&nodes,(ulong)token);
  __val = countMoves(target.field_2._12_4_,pos);
  utils::getTimestamp_abi_cxx11_();
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&gtest_ar_.message_);
  poVar4 = std::operator<<(poVar4," D");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,target.field_2._12_4_);
  poVar4 = std::operator<<(poVar4," ");
  this = (void *)std::ostream::operator<<(poVar4,__val);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  std::__cxx11::to_string(&local_b0,__val);
  iVar2 = std::__cxx11::string::compare((string *)&nodes);
  local_89 = iVar2 == 0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_88,
               (AssertionResult *)"target.compare(std::to_string(nodes)) == 0","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sneivandt[P]chess/test/perfttest/perfttest.cc"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::__cxx11::string::~string((string *)&nodes);
  return;
}

Assistant:

void test::perft::testPosition(const std::string& token, board::Board& pos)
{
    int depth = token[1] - '0';
    std::string target = token.substr(token.find(' ') + 1, token.length());
    int64_t nodes = countMoves(depth, pos);
    std::cout << utils::getTimestamp() << " D" << depth << " " << nodes << std::endl;
    ASSERT_TRUE(target.compare(std::to_string(nodes)) == 0);
}